

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator>::GetTargetMemoryStream
          (PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampSOperator> *this)

{
  pointer this_00;
  idx_t position_p;
  long in_RSI;
  MemoryStream *this_01;
  idx_t local_28;
  data_ptr_t local_20;
  
  this_01 = (MemoryStream *)(in_RSI + 0x60);
  local_20 = MemoryStream::GetData(this_01);
  local_28 = MemoryStream::GetCapacity(this_01);
  make_uniq<duckdb::MemoryStream,unsigned_char*,unsigned_long>((duckdb *)this,&local_20,&local_28);
  this_00 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
            operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                        *)this);
  position_p = MemoryStream::GetPosition(this_01);
  MemoryStream::SetPosition(this_00,position_p);
  return (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)this;
}

Assistant:

unique_ptr<MemoryStream> GetTargetMemoryStream() const {
		auto result = make_uniq<MemoryStream>(target_stream.GetData(), target_stream.GetCapacity());
		result->SetPosition(target_stream.GetPosition());
		return result;
	}